

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O1

void __thiscall Runtime::Runtime(Runtime *this,Instance *inst,Statistics *stats)

{
  allocator_type local_32;
  allocator_type local_31;
  
  Instance::Instance(&this->instance,inst);
  (this->relaxed_for_ratiotest).sense = 1;
  (this->relaxed_for_ratiotest).num_var = 0;
  (this->relaxed_for_ratiotest).num_con = 0;
  (this->relaxed_for_ratiotest).offset = 0.0;
  QpVector::QpVector(&(this->relaxed_for_ratiotest).c,0);
  *(undefined8 *)
   ((long)&(this->relaxed_for_ratiotest).Q.tran.value.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data + 9)
       = 0;
  *(undefined8 *)
   ((long)&(this->relaxed_for_ratiotest).Q.tran.value.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data +
   0x11) = 0;
  (this->relaxed_for_ratiotest).Q.tran.value.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->relaxed_for_ratiotest).Q.tran.value.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data + 8)
       = (pointer)0x0;
  *(pointer *)
   ((long)&(this->relaxed_for_ratiotest).Q.tran.index.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->relaxed_for_ratiotest).Q.tran.index.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->relaxed_for_ratiotest).Q.tran.start.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->relaxed_for_ratiotest).Q.tran.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->relaxed_for_ratiotest).Q.tran.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->relaxed_for_ratiotest).Q.tran.start.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  (this->relaxed_for_ratiotest).A.tran.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->relaxed_for_ratiotest).A.tran.start.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->relaxed_for_ratiotest).A.tran.start.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->relaxed_for_ratiotest).A.tran.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->relaxed_for_ratiotest).A.tran.index.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->relaxed_for_ratiotest).A.tran.index.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->relaxed_for_ratiotest).A.tran.value.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->relaxed_for_ratiotest).A.tran.value.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data + 8)
       = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->relaxed_for_ratiotest).A.tran.value.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data + 9)
       = 0;
  *(undefined8 *)
   ((long)&(this->relaxed_for_ratiotest).A.tran.value.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data +
   0x11) = 0;
  (this->relaxed_for_ratiotest).Q.mat.num_row = 0;
  (this->relaxed_for_ratiotest).Q.mat.num_col = 0;
  (this->relaxed_for_ratiotest).Q.mat.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->relaxed_for_ratiotest).Q.mat.start.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->relaxed_for_ratiotest).Q.mat.start.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->relaxed_for_ratiotest).Q.mat.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->relaxed_for_ratiotest).Q.mat.index.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->relaxed_for_ratiotest).Q.mat.index.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->relaxed_for_ratiotest).Q.mat.value.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->relaxed_for_ratiotest).Q.mat.value.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data + 8)
       = (pointer)0x0;
  *(pointer *)
   ((long)&(this->relaxed_for_ratiotest).Q.mat.value.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data +
   0x10) = (pointer)0x0;
  (this->relaxed_for_ratiotest).con_lo.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->relaxed_for_ratiotest).con_lo.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->relaxed_for_ratiotest).con_lo.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->relaxed_for_ratiotest).con_up.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->relaxed_for_ratiotest).con_up.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->relaxed_for_ratiotest).con_up.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->relaxed_for_ratiotest).var_up.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->relaxed_for_ratiotest).var_up.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->relaxed_for_ratiotest).var_lo.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->relaxed_for_ratiotest).var_up.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->relaxed_for_ratiotest).var_lo.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->relaxed_for_ratiotest).var_lo.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(pointer *)
   ((long)&(this->relaxed_for_ratiotest).A.mat.value.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data + 8)
       = (pointer)0x0;
  *(pointer *)
   ((long)&(this->relaxed_for_ratiotest).A.mat.value.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data +
   0x10) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->relaxed_for_ratiotest).A.mat.index.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->relaxed_for_ratiotest).A.mat.value.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->relaxed_for_ratiotest).A.mat.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->relaxed_for_ratiotest).A.mat.index.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->relaxed_for_ratiotest).A.mat.start.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->relaxed_for_ratiotest).A.mat.start.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->relaxed_for_ratiotest).A.mat.num_row = 0;
  (this->relaxed_for_ratiotest).A.mat.num_col = 0;
  (this->relaxed_for_ratiotest).A.mat.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->scaled).sense = 1;
  (this->scaled).num_var = 0;
  (this->scaled).num_con = 0;
  (this->scaled).offset = 0.0;
  QpVector::QpVector(&(this->scaled).c,0);
  *(undefined8 *)
   ((long)&(this->scaled).Q.tran.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data + 9) = 0;
  *(undefined8 *)
   ((long)&(this->scaled).Q.tran.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data + 0x11) = 0;
  (this->scaled).Q.tran.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->scaled).Q.tran.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->scaled).Q.tran.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->scaled).Q.tran.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->scaled).Q.tran.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->scaled).Q.tran.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->scaled).Q.tran.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->scaled).Q.tran.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  (this->scaled).A.tran.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->scaled).A.tran.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->scaled).A.tran.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->scaled).A.tran.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->scaled).A.tran.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->scaled).A.tran.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->scaled).A.tran.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->scaled).A.tran.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->scaled).A.tran.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data + 9) = 0;
  *(undefined8 *)
   ((long)&(this->scaled).A.tran.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data + 0x11) = 0;
  (this->scaled).Q.mat.num_row = 0;
  (this->scaled).Q.mat.num_col = 0;
  (this->scaled).Q.mat.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->scaled).Q.mat.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->scaled).Q.mat.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->scaled).Q.mat.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->scaled).Q.mat.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->scaled).Q.mat.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->scaled).Q.mat.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->scaled).Q.mat.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->scaled).Q.mat.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->scaled).con_lo.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->scaled).con_lo.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->scaled).con_lo.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->scaled).con_up.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->scaled).con_up.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->scaled).con_up.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->scaled).var_up.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->scaled).var_up.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->scaled).var_lo.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->scaled).var_up.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->scaled).var_lo.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->scaled).var_lo.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(pointer *)
   ((long)&(this->scaled).A.mat.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->scaled).A.mat.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->scaled).A.mat.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->scaled).A.mat.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->scaled).A.mat.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->scaled).A.mat.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->scaled).A.mat.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->scaled).A.mat.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->scaled).A.mat.num_row = 0;
  (this->scaled).A.mat.num_col = 0;
  (this->scaled).A.mat.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->perturbed).sense = 1;
  (this->perturbed).num_var = 0;
  (this->perturbed).num_con = 0;
  (this->perturbed).offset = 0.0;
  QpVector::QpVector(&(this->perturbed).c,0);
  *(undefined8 *)
   ((long)&(this->perturbed).Q.tran.value.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data + 9) = 0;
  *(undefined8 *)
   ((long)&(this->perturbed).Q.tran.value.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data + 0x11) = 0;
  (this->perturbed).Q.tran.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->perturbed).Q.tran.value.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->perturbed).Q.tran.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->perturbed).Q.tran.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->perturbed).Q.tran.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->perturbed).Q.tran.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->perturbed).Q.tran.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->perturbed).Q.tran.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  (this->perturbed).A.tran.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->perturbed).A.tran.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->perturbed).A.tran.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->perturbed).A.tran.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->perturbed).A.tran.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->perturbed).A.tran.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->perturbed).A.tran.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->perturbed).A.tran.value.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->perturbed).A.tran.value.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data + 9) = 0;
  *(undefined8 *)
   ((long)&(this->perturbed).A.tran.value.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data + 0x11) = 0;
  (this->perturbed).Q.mat.num_row = 0;
  (this->perturbed).Q.mat.num_col = 0;
  (this->perturbed).Q.mat.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->perturbed).Q.mat.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->perturbed).Q.mat.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->perturbed).Q.mat.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->perturbed).Q.mat.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->perturbed).Q.mat.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->perturbed).Q.mat.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->perturbed).Q.mat.value.super__Vector_base<double,_std::allocator<double>_>._M_impl
           .super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->perturbed).Q.mat.value.super__Vector_base<double,_std::allocator<double>_>._M_impl
           .super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->perturbed).con_lo.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->perturbed).con_lo.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->perturbed).con_lo.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->perturbed).con_up.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->perturbed).con_up.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->perturbed).con_up.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  memset(&(this->perturbed).A.mat,0,0x84);
  (this->settings).ratiotest_t = 1e-09;
  (this->settings).ratiotest_d = 1e-08;
  (this->settings).pricing = Devex;
  (this->settings).pnorm_zero_threshold = 1e-11;
  (this->settings).improvement_zero_threshold = 0.0001;
  (this->settings).d_zero_threshold = 1e-12;
  (this->settings).lambda_zero_threshold = 1e-09;
  (this->settings).pQp_zero_threshold = 1e-07;
  (this->settings).hessianregularization = false;
  (this->settings).hessianregularizationfactor = 1e-07;
  (this->settings).phase1strategy = HIGHS;
  (this->settings).phase1movefreevarsbasic = false;
  (this->settings).phase1boundfreevars = false;
  (this->settings).reportingfequency = 1;
  (this->settings).iteration_log.subscribers.
  super__Vector_base<std::function<void_(Statistics_&)>,_std::allocator<std::function<void_(Statistics_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->settings).iteration_log.subscribers.
  super__Vector_base<std::function<void_(Statistics_&)>,_std::allocator<std::function<void_(Statistics_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->settings).iteration_log.subscribers.
  super__Vector_base<std::function<void_(Statistics_&)>,_std::allocator<std::function<void_(Statistics_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->settings).qp_model_status_log.subscribers.
  super__Vector_base<std::function<void_(QpModelStatus_&)>,_std::allocator<std::function<void_(QpModelStatus_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->settings).qp_model_status_log.subscribers.
  super__Vector_base<std::function<void_(QpModelStatus_&)>,_std::allocator<std::function<void_(QpModelStatus_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->settings).qp_model_status_log.subscribers.
  super__Vector_base<std::function<void_(QpModelStatus_&)>,_std::allocator<std::function<void_(QpModelStatus_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->settings).nullspace_limit_log.subscribers.
  super__Vector_base<std::function<void_(int_&)>,_std::allocator<std::function<void_(int_&)>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->settings).nullspace_limit_log.subscribers.
  super__Vector_base<std::function<void_(int_&)>,_std::allocator<std::function<void_(int_&)>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->settings).nullspace_limit_log.subscribers.
  super__Vector_base<std::function<void_(int_&)>,_std::allocator<std::function<void_(int_&)>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->settings).nullspace_limit = 4000;
  (this->settings).reinvertfrequency = 1000;
  (this->settings).gradientrecomputefrequency = 100;
  (this->settings).reducedgradientrecomputefrequency = 0;
  (this->settings).reducedhessianrecomputefrequency = 0;
  (this->settings).iteration_limit = 0;
  (this->settings).time_limit = INFINITY;
  (this->settings).rowscaling = true;
  (this->settings).varscaling = true;
  (this->settings).perturbation = false;
  this->statistics = stats;
  QpVector::QpVector(&this->primal,(this->instance).num_var);
  QpVector::QpVector(&this->rowactivity,(this->instance).num_con);
  QpVector::QpVector(&this->dualvar,(this->instance).num_var);
  QpVector::QpVector(&this->dualcon,(this->instance).num_con);
  this->status = kUndetermined;
  std::vector<BasisStatus,_std::allocator<BasisStatus>_>::vector
            (&this->status_var,(long)(this->instance).num_var,&local_31);
  std::vector<BasisStatus,_std::allocator<BasisStatus>_>::vector
            (&this->status_con,(long)(this->instance).num_con,&local_32);
  return;
}

Assistant:

Runtime(Instance& inst, Statistics& stats)
      : instance(inst),
        statistics(stats),
        primal(QpVector(instance.num_var)),
        rowactivity(QpVector(instance.num_con)),
        dualvar(instance.num_var),
        dualcon(instance.num_con),
        status_var(instance.num_var),
        status_con(instance.num_con) {}